

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

bool pbrt::HasExtension(string *filename,string *e)

{
  char cVar1;
  pointer pcVar2;
  long *plVar3;
  _Alloc_hider _Var4;
  int iVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  string ext;
  string filenameExtension;
  long *local_a8;
  ulong local_a0;
  long local_98 [2];
  long *local_88;
  pointer local_80;
  string local_78;
  path local_58;
  
  local_a8 = local_98;
  pcVar2 = (e->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,pcVar2,pcVar2 + e->_M_string_length)
  ;
  if ((local_a0 != 0) && ((char)*local_a8 == '.')) {
    std::__cxx11::string::erase((ulong)&local_a8,0);
  }
  filesystem::path::path(&local_58,filename);
  filesystem::path::extension_abi_cxx11_(&local_78,&local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58.m_path);
  _Var4._M_p = local_78._M_dataplus._M_p;
  if (local_78._M_string_length < local_a0) {
    bVar8 = false;
  }
  else {
    bVar8 = local_a0 == 0;
    if (!bVar8) {
      local_88 = local_a8;
      cVar1 = local_78._M_dataplus._M_p[local_78._M_string_length - 1];
      iVar5 = tolower((int)*(char *)((long)local_a8 + (local_a0 - 1)));
      iVar6 = tolower((int)cVar1);
      plVar3 = local_88;
      if (iVar5 == iVar6) {
        local_80 = _Var4._M_p + (local_78._M_string_length - 2);
        lVar7 = 0;
        do {
          bVar8 = 1 - local_a0 == lVar7;
          if (bVar8) break;
          cVar1 = local_80[lVar7];
          iVar5 = tolower((int)*(char *)((long)plVar3 + lVar7 + (local_a0 - 2)));
          iVar6 = tolower((int)cVar1);
          lVar7 = lVar7 + -1;
        } while (iVar5 == iVar6);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  return bVar8;
}

Assistant:

bool HasExtension(const std::string &filename, const std::string &e) {
    std::string ext = e;
    if (!ext.empty() && ext[0] == '.')
        ext.erase(0, 1);

    std::string filenameExtension = filesystem::path(filename).extension();
    if (ext.size() > filenameExtension.size())
        return false;
    return std::equal(ext.rbegin(), ext.rend(), filenameExtension.rbegin(),
                      [](char a, char b) { return std::tolower(a) == std::tolower(b); });
}